

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx2_blend_popcnt_unroll8(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  undefined1 (*pauVar4) [32];
  undefined1 (*pauVar5) [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  uint uVar22;
  undefined1 (*pauVar23) [32];
  undefined1 (*pauVar24) [32];
  undefined1 (*pauVar25) [32];
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar26 [16];
  int j;
  int i_3;
  __m256i input1_2;
  __m256i input0_2;
  __m256i v1_2;
  __m256i v0_2;
  int i_2;
  __m256i input3_1;
  __m256i input2_1;
  __m256i input1_1;
  __m256i input0_1;
  __m256i v3_1;
  __m256i v2_1;
  __m256i v1_1;
  __m256i v0_1;
  int i_1;
  __m256i input7;
  __m256i input6;
  __m256i input5;
  __m256i input4;
  __m256i input3;
  __m256i input2;
  __m256i input1;
  __m256i input0;
  __m256i v7;
  __m256i v6;
  __m256i v5;
  __m256i v4;
  __m256i v3;
  __m256i v2;
  __m256i v1;
  __m256i v0;
  size_t i;
  uint32_t n_cycles;
  __m256i *data_vectors;
  undefined4 local_1868;
  undefined4 local_1864;
  undefined1 local_1860 [32];
  undefined1 local_1840 [32];
  undefined4 local_17c4;
  undefined1 local_17c0 [32];
  undefined1 local_17a0 [32];
  undefined1 local_1780 [32];
  undefined1 local_1760 [32];
  undefined4 local_16a4;
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined8 local_1490;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  
  uVar22 = in_ESI >> 4;
  for (local_1490 = 0; local_1490 + 8 <= (ulong)uVar22; local_1490 = local_1490 + 8) {
    pauVar23 = (undefined1 (*) [32])(in_RDI + local_1490 * 0x20);
    pauVar1 = (undefined1 (*) [32])(in_RDI + 0x20 + local_1490 * 0x20);
    pauVar25 = (undefined1 (*) [32])(in_RDI + 0x40 + local_1490 * 0x20);
    pauVar2 = (undefined1 (*) [32])(in_RDI + 0x60 + local_1490 * 0x20);
    pauVar24 = (undefined1 (*) [32])(in_RDI + 0x80 + local_1490 * 0x20);
    pauVar3 = (undefined1 (*) [32])(in_RDI + 0xa0 + local_1490 * 0x20);
    pauVar4 = (undefined1 (*) [32])(in_RDI + 0xc0 + local_1490 * 0x20);
    pauVar5 = (undefined1 (*) [32])(in_RDI + 0xe0 + local_1490 * 0x20);
    auVar6 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar6 = vpinsrw_avx(auVar6,0xff,2);
    auVar6 = vpinsrw_avx(auVar6,0xff,3);
    auVar6 = vpinsrw_avx(auVar6,0xff,4);
    auVar6 = vpinsrw_avx(auVar6,0xff,5);
    auVar6 = vpinsrw_avx(auVar6,0xff,6);
    auVar6 = vpinsrw_avx(auVar6,0xff,7);
    auVar7 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar7 = vpinsrw_avx(auVar7,0xff,2);
    auVar7 = vpinsrw_avx(auVar7,0xff,3);
    auVar7 = vpinsrw_avx(auVar7,0xff,4);
    auVar7 = vpinsrw_avx(auVar7,0xff,5);
    auVar7 = vpinsrw_avx(auVar7,0xff,6);
    auVar7 = vpinsrw_avx(auVar7,0xff,7);
    uStack_930 = auVar7._0_8_;
    uStack_928 = auVar7._8_8_;
    auVar21._16_8_ = uStack_930;
    auVar21._0_16_ = auVar6;
    auVar21._24_8_ = uStack_928;
    auVar8 = vpand_avx2(*pauVar23,auVar21);
    auVar9 = vpsllw_avx2(*pauVar1,ZEXT416(8));
    local_15c0 = vpor_avx2(auVar8,auVar9);
    auVar6 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar6 = vpinsrw_avx(auVar6,0xff00,2);
    auVar6 = vpinsrw_avx(auVar6,0xff00,3);
    auVar6 = vpinsrw_avx(auVar6,0xff00,4);
    auVar6 = vpinsrw_avx(auVar6,0xff00,5);
    auVar6 = vpinsrw_avx(auVar6,0xff00,6);
    auVar6 = vpinsrw_avx(auVar6,0xff00,7);
    auVar7 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar7 = vpinsrw_avx(auVar7,0xff00,2);
    auVar7 = vpinsrw_avx(auVar7,0xff00,3);
    auVar7 = vpinsrw_avx(auVar7,0xff00,4);
    auVar7 = vpinsrw_avx(auVar7,0xff00,5);
    auVar7 = vpinsrw_avx(auVar7,0xff00,6);
    auVar7 = vpinsrw_avx(auVar7,0xff00,7);
    uStack_8f0 = auVar7._0_8_;
    uStack_8e8 = auVar7._8_8_;
    auVar20._16_8_ = uStack_8f0;
    auVar20._0_16_ = auVar6;
    auVar20._24_8_ = uStack_8e8;
    auVar8 = vpand_avx2(*pauVar23,auVar20);
    auVar9 = vpsrlw_avx2(*pauVar1,ZEXT416(8));
    local_15e0 = vpor_avx2(auVar8,auVar9);
    auVar6 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar6 = vpinsrw_avx(auVar6,0xff,2);
    auVar6 = vpinsrw_avx(auVar6,0xff,3);
    auVar6 = vpinsrw_avx(auVar6,0xff,4);
    auVar6 = vpinsrw_avx(auVar6,0xff,5);
    auVar6 = vpinsrw_avx(auVar6,0xff,6);
    auVar6 = vpinsrw_avx(auVar6,0xff,7);
    auVar7 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar7 = vpinsrw_avx(auVar7,0xff,2);
    auVar7 = vpinsrw_avx(auVar7,0xff,3);
    auVar7 = vpinsrw_avx(auVar7,0xff,4);
    auVar7 = vpinsrw_avx(auVar7,0xff,5);
    auVar7 = vpinsrw_avx(auVar7,0xff,6);
    auVar7 = vpinsrw_avx(auVar7,0xff,7);
    uStack_8b0 = auVar7._0_8_;
    uStack_8a8 = auVar7._8_8_;
    auVar19._16_8_ = uStack_8b0;
    auVar19._0_16_ = auVar6;
    auVar19._24_8_ = uStack_8a8;
    auVar8 = vpand_avx2(*pauVar25,auVar19);
    auVar9 = vpsllw_avx2(*pauVar2,ZEXT416(8));
    local_1600 = vpor_avx2(auVar8,auVar9);
    auVar6 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar6 = vpinsrw_avx(auVar6,0xff00,2);
    auVar6 = vpinsrw_avx(auVar6,0xff00,3);
    auVar6 = vpinsrw_avx(auVar6,0xff00,4);
    auVar6 = vpinsrw_avx(auVar6,0xff00,5);
    auVar6 = vpinsrw_avx(auVar6,0xff00,6);
    auVar6 = vpinsrw_avx(auVar6,0xff00,7);
    auVar7 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar7 = vpinsrw_avx(auVar7,0xff00,2);
    auVar7 = vpinsrw_avx(auVar7,0xff00,3);
    auVar7 = vpinsrw_avx(auVar7,0xff00,4);
    auVar7 = vpinsrw_avx(auVar7,0xff00,5);
    auVar7 = vpinsrw_avx(auVar7,0xff00,6);
    auVar7 = vpinsrw_avx(auVar7,0xff00,7);
    uStack_870 = auVar7._0_8_;
    uStack_868 = auVar7._8_8_;
    auVar18._16_8_ = uStack_870;
    auVar18._0_16_ = auVar6;
    auVar18._24_8_ = uStack_868;
    auVar8 = vpand_avx2(*pauVar25,auVar18);
    auVar9 = vpsrlw_avx2(*pauVar2,ZEXT416(8));
    local_1620 = vpor_avx2(auVar8,auVar9);
    auVar6 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar6 = vpinsrw_avx(auVar6,0xff,2);
    auVar6 = vpinsrw_avx(auVar6,0xff,3);
    auVar6 = vpinsrw_avx(auVar6,0xff,4);
    auVar6 = vpinsrw_avx(auVar6,0xff,5);
    auVar6 = vpinsrw_avx(auVar6,0xff,6);
    auVar6 = vpinsrw_avx(auVar6,0xff,7);
    auVar7 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar7 = vpinsrw_avx(auVar7,0xff,2);
    auVar7 = vpinsrw_avx(auVar7,0xff,3);
    auVar7 = vpinsrw_avx(auVar7,0xff,4);
    auVar7 = vpinsrw_avx(auVar7,0xff,5);
    auVar7 = vpinsrw_avx(auVar7,0xff,6);
    auVar7 = vpinsrw_avx(auVar7,0xff,7);
    uStack_830 = auVar7._0_8_;
    uStack_828 = auVar7._8_8_;
    auVar17._16_8_ = uStack_830;
    auVar17._0_16_ = auVar6;
    auVar17._24_8_ = uStack_828;
    auVar8 = vpand_avx2(*pauVar24,auVar17);
    auVar9 = vpsllw_avx2(*pauVar3,ZEXT416(8));
    local_1640 = vpor_avx2(auVar8,auVar9);
    auVar6 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar6 = vpinsrw_avx(auVar6,0xff00,2);
    auVar6 = vpinsrw_avx(auVar6,0xff00,3);
    auVar6 = vpinsrw_avx(auVar6,0xff00,4);
    auVar6 = vpinsrw_avx(auVar6,0xff00,5);
    auVar6 = vpinsrw_avx(auVar6,0xff00,6);
    auVar6 = vpinsrw_avx(auVar6,0xff00,7);
    auVar7 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar7 = vpinsrw_avx(auVar7,0xff00,2);
    auVar7 = vpinsrw_avx(auVar7,0xff00,3);
    auVar7 = vpinsrw_avx(auVar7,0xff00,4);
    auVar7 = vpinsrw_avx(auVar7,0xff00,5);
    auVar7 = vpinsrw_avx(auVar7,0xff00,6);
    auVar7 = vpinsrw_avx(auVar7,0xff00,7);
    uStack_7f0 = auVar7._0_8_;
    uStack_7e8 = auVar7._8_8_;
    auVar16._16_8_ = uStack_7f0;
    auVar16._0_16_ = auVar6;
    auVar16._24_8_ = uStack_7e8;
    auVar8 = vpand_avx2(*pauVar24,auVar16);
    auVar9 = vpsrlw_avx2(*pauVar3,ZEXT416(8));
    local_1660 = vpor_avx2(auVar8,auVar9);
    auVar6 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar6 = vpinsrw_avx(auVar6,0xff,2);
    auVar6 = vpinsrw_avx(auVar6,0xff,3);
    auVar6 = vpinsrw_avx(auVar6,0xff,4);
    auVar6 = vpinsrw_avx(auVar6,0xff,5);
    auVar6 = vpinsrw_avx(auVar6,0xff,6);
    auVar6 = vpinsrw_avx(auVar6,0xff,7);
    auVar7 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar7 = vpinsrw_avx(auVar7,0xff,2);
    auVar7 = vpinsrw_avx(auVar7,0xff,3);
    auVar7 = vpinsrw_avx(auVar7,0xff,4);
    auVar7 = vpinsrw_avx(auVar7,0xff,5);
    auVar7 = vpinsrw_avx(auVar7,0xff,6);
    auVar7 = vpinsrw_avx(auVar7,0xff,7);
    uStack_7b0 = auVar7._0_8_;
    uStack_7a8 = auVar7._8_8_;
    auVar9._16_8_ = uStack_7b0;
    auVar9._0_16_ = auVar6;
    auVar9._24_8_ = uStack_7a8;
    auVar8 = vpand_avx2(*pauVar4,auVar9);
    auVar9 = vpsllw_avx2(*pauVar5,ZEXT416(8));
    local_1680 = vpor_avx2(auVar8,auVar9);
    auVar6 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar6 = vpinsrw_avx(auVar6,0xff00,2);
    auVar6 = vpinsrw_avx(auVar6,0xff00,3);
    auVar6 = vpinsrw_avx(auVar6,0xff00,4);
    auVar6 = vpinsrw_avx(auVar6,0xff00,5);
    auVar6 = vpinsrw_avx(auVar6,0xff00,6);
    auVar6 = vpinsrw_avx(auVar6,0xff00,7);
    auVar7 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar7 = vpinsrw_avx(auVar7,0xff00,2);
    auVar7 = vpinsrw_avx(auVar7,0xff00,3);
    auVar7 = vpinsrw_avx(auVar7,0xff00,4);
    auVar7 = vpinsrw_avx(auVar7,0xff00,5);
    auVar7 = vpinsrw_avx(auVar7,0xff00,6);
    auVar7 = vpinsrw_avx(auVar7,0xff00,7);
    auVar26 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar6;
    uStack_770 = auVar26._0_8_;
    uStack_768 = auVar26._8_8_;
    auVar8._16_8_ = uStack_770;
    auVar8._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar7;
    auVar8._24_8_ = uStack_768;
    auVar8 = vpand_avx2(*pauVar4,auVar8);
    auVar9 = vpsrlw_avx2(*pauVar5,ZEXT416(8));
    local_16a0 = vpor_avx2(auVar8,auVar9);
    for (local_16a4 = 0; local_16a4 < 8; local_16a4 = local_16a4 + 1) {
      *(int *)(in_RDX + (long)(7 - local_16a4) * 4) =
           POPCOUNT((uint)(SUB321(local_15c0 >> 7,0) & 1) |
                    (uint)(SUB321(local_15c0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_15c0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_15c0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_15c0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_15c0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_15c0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_15c0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_15c0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_15c0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_15c0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_15c0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_15c0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_15c0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_15c0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_15c0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_15c0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_15c0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_15c0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_15c0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_15c0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_15c0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_15c0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_15c0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_15c0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_15c0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_15c0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_15c0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_15c0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_15c0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_15c0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_15c0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_16a4) * 4);
      *(int *)(in_RDX + (long)(0xf - local_16a4) * 4) =
           POPCOUNT((uint)(SUB321(local_15e0 >> 7,0) & 1) |
                    (uint)(SUB321(local_15e0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_15e0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_15e0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_15e0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_15e0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_15e0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_15e0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_15e0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_15e0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_15e0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_15e0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_15e0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_15e0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_15e0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_15e0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_15e0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_15e0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_15e0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_15e0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_15e0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_15e0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_15e0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_15e0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_15e0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_15e0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_15e0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_15e0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_15e0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_15e0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_15e0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_15e0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_16a4) * 4);
      *(int *)(in_RDX + (long)(7 - local_16a4) * 4) =
           POPCOUNT((uint)(SUB321(local_1600 >> 7,0) & 1) |
                    (uint)(SUB321(local_1600 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_1600 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_1600 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_1600 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_1600 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_1600 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_1600 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_1600 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_1600 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_1600 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_1600 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_1600 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_1600 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_1600 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_1600 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_1600 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_1600 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_1600 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_1600 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_1600 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_1600 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_1600 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_1600 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_1600 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_1600 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_1600 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_1600 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_1600 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_1600 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_1600 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_1600[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_16a4) * 4);
      *(int *)(in_RDX + (long)(0xf - local_16a4) * 4) =
           POPCOUNT((uint)(SUB321(local_1620 >> 7,0) & 1) |
                    (uint)(SUB321(local_1620 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_1620 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_1620 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_1620 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_1620 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_1620 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_1620 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_1620 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_1620 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_1620 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_1620 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_1620 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_1620 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_1620 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_1620 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_1620 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_1620 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_1620 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_1620 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_1620 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_1620 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_1620 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_1620 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_1620 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_1620 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_1620 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_1620 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_1620 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_1620 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_1620 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_1620[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_16a4) * 4);
      *(int *)(in_RDX + (long)(7 - local_16a4) * 4) =
           POPCOUNT((uint)(SUB321(local_1640 >> 7,0) & 1) |
                    (uint)(SUB321(local_1640 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_1640 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_1640 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_1640 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_1640 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_1640 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_1640 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_1640 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_1640 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_1640 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_1640 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_1640 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_1640 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_1640 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_1640 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_1640 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_1640 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_1640 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_1640 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_1640 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_1640 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_1640 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_1640 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_1640 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_1640 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_1640 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_1640 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_1640 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_1640 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_1640 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_1640[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_16a4) * 4);
      *(int *)(in_RDX + (long)(0xf - local_16a4) * 4) =
           POPCOUNT((uint)(SUB321(local_1660 >> 7,0) & 1) |
                    (uint)(SUB321(local_1660 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_1660 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_1660 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_1660 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_1660 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_1660 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_1660 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_1660 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_1660 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_1660 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_1660 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_1660 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_1660 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_1660 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_1660 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_1660 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_1660 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_1660 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_1660 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_1660 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_1660 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_1660 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_1660 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_1660 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_1660 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_1660 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_1660 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_1660 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_1660 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_1660 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_1660[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_16a4) * 4);
      *(int *)(in_RDX + (long)(7 - local_16a4) * 4) =
           POPCOUNT((uint)(SUB321(local_1680 >> 7,0) & 1) |
                    (uint)(SUB321(local_1680 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_1680 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_1680 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_1680 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_1680 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_1680 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_1680 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_1680 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_1680 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_1680 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_1680 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_1680 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_1680 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_1680 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_1680 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_1680 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_1680 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_1680 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_1680 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_1680 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_1680 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_1680 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_1680 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_1680 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_1680 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_1680 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_1680 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_1680 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_1680 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_1680 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_1680[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_16a4) * 4);
      *(int *)(in_RDX + (long)(0xf - local_16a4) * 4) =
           POPCOUNT((uint)(SUB321(local_16a0 >> 7,0) & 1) |
                    (uint)(SUB321(local_16a0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_16a0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_16a0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_16a0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_16a0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_16a0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_16a0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_16a0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_16a0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_16a0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_16a0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_16a0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_16a0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_16a0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_16a0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_16a0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_16a0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_16a0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_16a0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_16a0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_16a0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_16a0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_16a0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_16a0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_16a0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_16a0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_16a0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_16a0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_16a0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_16a0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_16a0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_16a4) * 4);
      local_15c0 = vpaddb_avx2(local_15c0,local_15c0);
      local_15e0 = vpaddb_avx2(local_15e0,local_15e0);
      local_1600 = vpaddb_avx2(local_1600,local_1600);
      local_1620 = vpaddb_avx2(local_1620,local_1620);
      local_1640 = vpaddb_avx2(local_1640,local_1640);
      local_1660 = vpaddb_avx2(local_1660,local_1660);
      local_1680 = vpaddb_avx2(local_1680,local_1680);
      local_16a0 = vpaddb_avx2(local_16a0,local_16a0);
    }
  }
  for (; local_1490 + 4 <= (ulong)uVar22; local_1490 = local_1490 + 4) {
    pauVar24 = (undefined1 (*) [32])(in_RDI + local_1490 * 0x20);
    pauVar1 = (undefined1 (*) [32])(in_RDI + 0x20 + local_1490 * 0x20);
    pauVar25 = (undefined1 (*) [32])(in_RDI + 0x40 + local_1490 * 0x20);
    pauVar2 = (undefined1 (*) [32])(in_RDI + 0x60 + local_1490 * 0x20);
    auVar6 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar6 = vpinsrw_avx(auVar6,0xff,2);
    auVar6 = vpinsrw_avx(auVar6,0xff,3);
    auVar6 = vpinsrw_avx(auVar6,0xff,4);
    auVar6 = vpinsrw_avx(auVar6,0xff,5);
    auVar6 = vpinsrw_avx(auVar6,0xff,6);
    auVar6 = vpinsrw_avx(auVar6,0xff,7);
    auVar7 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar7 = vpinsrw_avx(auVar7,0xff,2);
    auVar7 = vpinsrw_avx(auVar7,0xff,3);
    auVar7 = vpinsrw_avx(auVar7,0xff,4);
    auVar7 = vpinsrw_avx(auVar7,0xff,5);
    auVar7 = vpinsrw_avx(auVar7,0xff,6);
    auVar7 = vpinsrw_avx(auVar7,0xff,7);
    uStack_730 = auVar7._0_8_;
    uStack_728 = auVar7._8_8_;
    auVar15._16_8_ = uStack_730;
    auVar15._0_16_ = auVar6;
    auVar15._24_8_ = uStack_728;
    auVar8 = vpand_avx2(*pauVar24,auVar15);
    auVar9 = vpsllw_avx2(*pauVar1,ZEXT416(8));
    local_1760 = vpor_avx2(auVar8,auVar9);
    auVar6 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar6 = vpinsrw_avx(auVar6,0xff00,2);
    auVar6 = vpinsrw_avx(auVar6,0xff00,3);
    auVar6 = vpinsrw_avx(auVar6,0xff00,4);
    auVar6 = vpinsrw_avx(auVar6,0xff00,5);
    auVar6 = vpinsrw_avx(auVar6,0xff00,6);
    auVar6 = vpinsrw_avx(auVar6,0xff00,7);
    auVar7 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar7 = vpinsrw_avx(auVar7,0xff00,2);
    auVar7 = vpinsrw_avx(auVar7,0xff00,3);
    auVar7 = vpinsrw_avx(auVar7,0xff00,4);
    auVar7 = vpinsrw_avx(auVar7,0xff00,5);
    auVar7 = vpinsrw_avx(auVar7,0xff00,6);
    auVar7 = vpinsrw_avx(auVar7,0xff00,7);
    uStack_6f0 = auVar7._0_8_;
    uStack_6e8 = auVar7._8_8_;
    auVar14._16_8_ = uStack_6f0;
    auVar14._0_16_ = auVar6;
    auVar14._24_8_ = uStack_6e8;
    auVar8 = vpand_avx2(*pauVar24,auVar14);
    auVar9 = vpsrlw_avx2(*pauVar1,ZEXT416(8));
    local_1780 = vpor_avx2(auVar8,auVar9);
    auVar6 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar6 = vpinsrw_avx(auVar6,0xff,2);
    auVar6 = vpinsrw_avx(auVar6,0xff,3);
    auVar6 = vpinsrw_avx(auVar6,0xff,4);
    auVar6 = vpinsrw_avx(auVar6,0xff,5);
    auVar6 = vpinsrw_avx(auVar6,0xff,6);
    auVar6 = vpinsrw_avx(auVar6,0xff,7);
    auVar7 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar7 = vpinsrw_avx(auVar7,0xff,2);
    auVar7 = vpinsrw_avx(auVar7,0xff,3);
    auVar7 = vpinsrw_avx(auVar7,0xff,4);
    auVar7 = vpinsrw_avx(auVar7,0xff,5);
    auVar7 = vpinsrw_avx(auVar7,0xff,6);
    auVar7 = vpinsrw_avx(auVar7,0xff,7);
    uStack_6b0 = auVar7._0_8_;
    uStack_6a8 = auVar7._8_8_;
    auVar13._16_8_ = uStack_6b0;
    auVar13._0_16_ = auVar6;
    auVar13._24_8_ = uStack_6a8;
    auVar8 = vpand_avx2(*pauVar25,auVar13);
    auVar9 = vpsllw_avx2(*pauVar2,ZEXT416(8));
    local_17a0 = vpor_avx2(auVar8,auVar9);
    auVar6 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar6 = vpinsrw_avx(auVar6,0xff00,2);
    auVar6 = vpinsrw_avx(auVar6,0xff00,3);
    auVar6 = vpinsrw_avx(auVar6,0xff00,4);
    auVar6 = vpinsrw_avx(auVar6,0xff00,5);
    auVar6 = vpinsrw_avx(auVar6,0xff00,6);
    auVar6 = vpinsrw_avx(auVar6,0xff00,7);
    auVar7 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar7 = vpinsrw_avx(auVar7,0xff00,2);
    auVar7 = vpinsrw_avx(auVar7,0xff00,3);
    auVar7 = vpinsrw_avx(auVar7,0xff00,4);
    auVar7 = vpinsrw_avx(auVar7,0xff00,5);
    auVar7 = vpinsrw_avx(auVar7,0xff00,6);
    auVar7 = vpinsrw_avx(auVar7,0xff00,7);
    auVar26 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar6;
    uStack_670 = auVar26._0_8_;
    uStack_668 = auVar26._8_8_;
    auVar12._16_8_ = uStack_670;
    auVar12._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar7;
    auVar12._24_8_ = uStack_668;
    auVar8 = vpand_avx2(*pauVar25,auVar12);
    auVar9 = vpsrlw_avx2(*pauVar2,ZEXT416(8));
    local_17c0 = vpor_avx2(auVar8,auVar9);
    for (local_17c4 = 0; local_17c4 < 8; local_17c4 = local_17c4 + 1) {
      *(int *)(in_RDX + (long)(7 - local_17c4) * 4) =
           POPCOUNT((uint)(SUB321(local_1760 >> 7,0) & 1) |
                    (uint)(SUB321(local_1760 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_1760 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_1760 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_1760 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_1760 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_1760 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_1760 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_1760 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_1760 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_1760 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_1760 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_1760 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_1760 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_1760 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_1760 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_1760 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_1760 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_1760 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_1760 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_1760 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_1760 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_1760 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_1760 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_1760 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_1760 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_1760 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_1760 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_1760 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_1760 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_1760 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_1760[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_17c4) * 4);
      *(int *)(in_RDX + (long)(0xf - local_17c4) * 4) =
           POPCOUNT((uint)(SUB321(local_1780 >> 7,0) & 1) |
                    (uint)(SUB321(local_1780 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_1780 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_1780 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_1780 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_1780 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_1780 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_1780 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_1780 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_1780 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_1780 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_1780 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_1780 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_1780 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_1780 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_1780 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_1780 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_1780 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_1780 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_1780 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_1780 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_1780 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_1780 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_1780 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_1780 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_1780 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_1780 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_1780 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_1780 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_1780 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_1780 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_1780[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_17c4) * 4);
      *(int *)(in_RDX + (long)(7 - local_17c4) * 4) =
           POPCOUNT((uint)(SUB321(local_17a0 >> 7,0) & 1) |
                    (uint)(SUB321(local_17a0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_17a0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_17a0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_17a0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_17a0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_17a0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_17a0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_17a0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_17a0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_17a0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_17a0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_17a0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_17a0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_17a0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_17a0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_17a0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_17a0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_17a0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_17a0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_17a0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_17a0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_17a0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_17a0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_17a0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_17a0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_17a0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_17a0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_17a0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_17a0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_17a0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_17a0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_17c4) * 4);
      *(int *)(in_RDX + (long)(0xf - local_17c4) * 4) =
           POPCOUNT((uint)(SUB321(local_17c0 >> 7,0) & 1) |
                    (uint)(SUB321(local_17c0 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_17c0 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_17c0 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_17c0 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_17c0 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_17c0 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_17c0 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_17c0 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_17c0 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_17c0 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_17c0 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_17c0 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_17c0 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_17c0 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_17c0 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_17c0 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_17c0 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_17c0 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_17c0 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_17c0 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_17c0 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_17c0 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_17c0 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_17c0 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_17c0 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_17c0 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_17c0 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_17c0 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_17c0 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_17c0 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_17c0[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_17c4) * 4);
      local_1760 = vpaddb_avx2(local_1760,local_1760);
      local_1780 = vpaddb_avx2(local_1780,local_1780);
      local_17a0 = vpaddb_avx2(local_17a0,local_17a0);
      local_17c0 = vpaddb_avx2(local_17c0,local_17c0);
    }
  }
  for (; local_1490 + 2 <= (ulong)uVar22; local_1490 = local_1490 + 2) {
    pauVar25 = (undefined1 (*) [32])(in_RDI + local_1490 * 0x20);
    pauVar1 = (undefined1 (*) [32])(in_RDI + 0x20 + local_1490 * 0x20);
    auVar6 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar6 = vpinsrw_avx(auVar6,0xff,2);
    auVar6 = vpinsrw_avx(auVar6,0xff,3);
    auVar6 = vpinsrw_avx(auVar6,0xff,4);
    auVar6 = vpinsrw_avx(auVar6,0xff,5);
    auVar6 = vpinsrw_avx(auVar6,0xff,6);
    auVar6 = vpinsrw_avx(auVar6,0xff,7);
    auVar7 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar7 = vpinsrw_avx(auVar7,0xff,2);
    auVar7 = vpinsrw_avx(auVar7,0xff,3);
    auVar7 = vpinsrw_avx(auVar7,0xff,4);
    auVar7 = vpinsrw_avx(auVar7,0xff,5);
    auVar7 = vpinsrw_avx(auVar7,0xff,6);
    auVar7 = vpinsrw_avx(auVar7,0xff,7);
    uStack_630 = auVar7._0_8_;
    uStack_628 = auVar7._8_8_;
    auVar11._16_8_ = uStack_630;
    auVar11._0_16_ = auVar6;
    auVar11._24_8_ = uStack_628;
    auVar8 = vpand_avx2(*pauVar25,auVar11);
    auVar9 = vpsllw_avx2(*pauVar1,ZEXT416(8));
    local_1840 = vpor_avx2(auVar8,auVar9);
    auVar6 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar6 = vpinsrw_avx(auVar6,0xff00,2);
    auVar6 = vpinsrw_avx(auVar6,0xff00,3);
    auVar6 = vpinsrw_avx(auVar6,0xff00,4);
    auVar6 = vpinsrw_avx(auVar6,0xff00,5);
    auVar6 = vpinsrw_avx(auVar6,0xff00,6);
    auVar6 = vpinsrw_avx(auVar6,0xff00,7);
    auVar7 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar7 = vpinsrw_avx(auVar7,0xff00,2);
    auVar7 = vpinsrw_avx(auVar7,0xff00,3);
    auVar7 = vpinsrw_avx(auVar7,0xff00,4);
    auVar7 = vpinsrw_avx(auVar7,0xff00,5);
    auVar7 = vpinsrw_avx(auVar7,0xff00,6);
    auVar7 = vpinsrw_avx(auVar7,0xff00,7);
    auVar26 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar6;
    uStack_5f0 = auVar26._0_8_;
    uStack_5e8 = auVar26._8_8_;
    auVar10._16_8_ = uStack_5f0;
    auVar10._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar7;
    auVar10._24_8_ = uStack_5e8;
    auVar8 = vpand_avx2(*pauVar25,auVar10);
    auVar9 = vpsrlw_avx2(*pauVar1,ZEXT416(8));
    local_1860 = vpor_avx2(auVar8,auVar9);
    for (local_1864 = 0; local_1864 < 8; local_1864 = local_1864 + 1) {
      *(int *)(in_RDX + (long)(7 - local_1864) * 4) =
           POPCOUNT((uint)(SUB321(local_1840 >> 7,0) & 1) |
                    (uint)(SUB321(local_1840 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_1840 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_1840 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_1840 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_1840 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_1840 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_1840 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_1840 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_1840 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_1840 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_1840 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_1840 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_1840 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_1840 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_1840 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_1840 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_1840 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_1840 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_1840 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_1840 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_1840 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_1840 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_1840 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_1840 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_1840 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_1840 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_1840 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_1840 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_1840 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_1840 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_1840[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(7 - local_1864) * 4);
      *(int *)(in_RDX + (long)(0xf - local_1864) * 4) =
           POPCOUNT((uint)(SUB321(local_1860 >> 7,0) & 1) |
                    (uint)(SUB321(local_1860 >> 0xf,0) & 1) << 1 |
                    (uint)(SUB321(local_1860 >> 0x17,0) & 1) << 2 |
                    (uint)(SUB321(local_1860 >> 0x1f,0) & 1) << 3 |
                    (uint)(SUB321(local_1860 >> 0x27,0) & 1) << 4 |
                    (uint)(SUB321(local_1860 >> 0x2f,0) & 1) << 5 |
                    (uint)(SUB321(local_1860 >> 0x37,0) & 1) << 6 |
                    (uint)(SUB321(local_1860 >> 0x3f,0) & 1) << 7 |
                    (uint)(SUB321(local_1860 >> 0x47,0) & 1) << 8 |
                    (uint)(SUB321(local_1860 >> 0x4f,0) & 1) << 9 |
                    (uint)(SUB321(local_1860 >> 0x57,0) & 1) << 10 |
                    (uint)(SUB321(local_1860 >> 0x5f,0) & 1) << 0xb |
                    (uint)(SUB321(local_1860 >> 0x67,0) & 1) << 0xc |
                    (uint)(SUB321(local_1860 >> 0x6f,0) & 1) << 0xd |
                    (uint)(SUB321(local_1860 >> 0x77,0) & 1) << 0xe |
                    (uint)SUB321(local_1860 >> 0x7f,0) << 0xf |
                    (uint)(SUB321(local_1860 >> 0x87,0) & 1) << 0x10 |
                    (uint)(SUB321(local_1860 >> 0x8f,0) & 1) << 0x11 |
                    (uint)(SUB321(local_1860 >> 0x97,0) & 1) << 0x12 |
                    (uint)(SUB321(local_1860 >> 0x9f,0) & 1) << 0x13 |
                    (uint)(SUB321(local_1860 >> 0xa7,0) & 1) << 0x14 |
                    (uint)(SUB321(local_1860 >> 0xaf,0) & 1) << 0x15 |
                    (uint)(SUB321(local_1860 >> 0xb7,0) & 1) << 0x16 |
                    (uint)SUB321(local_1860 >> 0xbf,0) << 0x17 |
                    (uint)(SUB321(local_1860 >> 199,0) & 1) << 0x18 |
                    (uint)(SUB321(local_1860 >> 0xcf,0) & 1) << 0x19 |
                    (uint)(SUB321(local_1860 >> 0xd7,0) & 1) << 0x1a |
                    (uint)(SUB321(local_1860 >> 0xdf,0) & 1) << 0x1b |
                    (uint)(SUB321(local_1860 >> 0xe7,0) & 1) << 0x1c |
                    (uint)(SUB321(local_1860 >> 0xef,0) & 1) << 0x1d |
                    (uint)(SUB321(local_1860 >> 0xf7,0) & 1) << 0x1e |
                    (uint)(byte)(local_1860[0x1f] >> 7) << 0x1f) +
           *(int *)(in_RDX + (long)(0xf - local_1864) * 4);
      local_1840 = vpaddb_avx2(local_1840,local_1840);
      local_1860 = vpaddb_avx2(local_1860,local_1860);
    }
  }
  for (local_1490 = local_1490 << 4; local_1490 < in_ESI; local_1490 = local_1490 + 1) {
    for (local_1868 = 0; local_1868 < 0x10; local_1868 = local_1868 + 1) {
      *(int *)(in_RDX + (long)local_1868 * 4) =
           ((int)((uint)*(ushort *)(in_RDI + local_1490 * 2) & 1 << ((byte)local_1868 & 0x1f)) >>
           ((byte)local_1868 & 0x1f)) + *(int *)(in_RDX + (long)local_1868 * 4);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_blend_popcnt_unroll8(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m256i* data_vectors = (const __m256i*)(array);
    const uint32_t n_cycles = len / 16;

    size_t i = 0;
    for (/**/; i + 8 <= n_cycles; i += 8) {
#define L(p) __m256i v##p = _mm256_loadu_si256(data_vectors+i+p);
        L(0) L(1) L(2) L(3)
        L(4) L(5) L(6) L(7) 
        
#define U0(p,k) __m256i input##p = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16(0x00FF)), _mm256_slli_epi16(v##k, 8));
#define U1(p,k) __m256i input##k = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16(0xFF00)), _mm256_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)
       U(0,1) U(2, 3) U(4, 5) U(6, 7)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A(2, 3) A(4, 5) A(6, 7)

#define P0(p) input##p = _mm256_add_epi8(input##p, input##p);
#define P(p, k) input##p = P0(p) P0(k)
            P(0,1) P(2, 3) P(4, 5) P(6, 7)
        }
    }

    for (/**/; i + 4 <= n_cycles; i += 4) {
        L(0) L(1) L(2) L(3)
        U(0,1) U(2, 3)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A( 2, 3)
            P(0,1) P( 2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 16;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P

    return 0;
}